

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O1

void ConvertRGB24ToY_SSE2(uint8_t *rgb,uint8_t *y,int width)

{
  uint8_t *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  unkuint9 Var50;
  undefined1 auVar51 [11];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  unkuint9 Var54;
  undefined1 auVar55 [11];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  unkuint9 Var58;
  undefined1 auVar59 [11];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int iVar68;
  long lVar69;
  long lVar70;
  byte bVar72;
  undefined1 uVar73;
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  unkint10 Var76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined2 uVar79;
  undefined2 uVar85;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  __m128i rgb_plane [6];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  
  auVar67 = _DAT_0012deb0;
  auVar66 = _DAT_0012dea0;
  if ((int)(width & 0xffffffe0U) < 1) {
    iVar68 = 0;
  }
  else {
    lVar69 = 0;
    do {
      rgb_plane[0][0]._0_1_ = *rgb;
      rgb_plane[0][0]._1_1_ = rgb[3];
      rgb_plane[0][0]._2_1_ = rgb[6];
      rgb_plane[0][0]._3_1_ = rgb[9];
      rgb_plane[0][0]._4_1_ = rgb[0xc];
      rgb_plane[0][0]._5_1_ = rgb[0xf];
      rgb_plane[0][0]._6_1_ = rgb[0x12];
      rgb_plane[0][0]._7_1_ = rgb[0x15];
      rgb_plane[0][1]._0_1_ = rgb[0x18];
      rgb_plane[0][1]._1_1_ = rgb[0x1b];
      rgb_plane[0][1]._2_1_ = rgb[0x1e];
      rgb_plane[0][1]._3_1_ = rgb[0x21];
      rgb_plane[0][1]._4_1_ = rgb[0x24];
      rgb_plane[0][1]._5_1_ = rgb[0x27];
      rgb_plane[0][1]._6_1_ = rgb[0x2a];
      rgb_plane[0][1]._7_1_ = rgb[0x2d];
      rgb_plane[1][0]._0_1_ = rgb[0x30];
      rgb_plane[1][0]._1_1_ = rgb[0x33];
      rgb_plane[1][0]._2_1_ = rgb[0x36];
      rgb_plane[1][0]._3_1_ = rgb[0x39];
      rgb_plane[1][0]._4_1_ = rgb[0x3c];
      rgb_plane[1][0]._5_1_ = rgb[0x3f];
      rgb_plane[1][0]._6_1_ = rgb[0x42];
      rgb_plane[1][0]._7_1_ = rgb[0x45];
      rgb_plane[1][1]._0_1_ = rgb[0x48];
      rgb_plane[1][1]._1_1_ = rgb[0x4b];
      rgb_plane[1][1]._2_1_ = rgb[0x4e];
      rgb_plane[1][1]._3_1_ = rgb[0x51];
      rgb_plane[1][1]._4_1_ = rgb[0x54];
      rgb_plane[1][1]._5_1_ = rgb[0x57];
      rgb_plane[1][1]._6_1_ = rgb[0x5a];
      rgb_plane[1][1]._7_1_ = rgb[0x5d];
      rgb_plane[2][0]._0_1_ = rgb[1];
      rgb_plane[2][0]._1_1_ = rgb[4];
      rgb_plane[2][0]._2_1_ = rgb[7];
      rgb_plane[2][0]._3_1_ = rgb[10];
      rgb_plane[2][0]._4_1_ = rgb[0xd];
      rgb_plane[2][0]._5_1_ = rgb[0x10];
      rgb_plane[2][0]._6_1_ = rgb[0x13];
      rgb_plane[2][0]._7_1_ = rgb[0x16];
      rgb_plane[2][1]._0_1_ = rgb[0x19];
      rgb_plane[2][1]._1_1_ = rgb[0x1c];
      rgb_plane[2][1]._2_1_ = rgb[0x1f];
      rgb_plane[2][1]._3_1_ = rgb[0x22];
      rgb_plane[2][1]._4_1_ = rgb[0x25];
      rgb_plane[2][1]._5_1_ = rgb[0x28];
      rgb_plane[2][1]._6_1_ = rgb[0x2b];
      rgb_plane[2][1]._7_1_ = rgb[0x2e];
      rgb_plane[3][0]._0_1_ = rgb[0x31];
      rgb_plane[3][0]._1_1_ = rgb[0x34];
      rgb_plane[3][0]._2_1_ = rgb[0x37];
      rgb_plane[3][0]._3_1_ = rgb[0x3a];
      rgb_plane[3][0]._4_1_ = rgb[0x3d];
      rgb_plane[3][0]._5_1_ = rgb[0x40];
      rgb_plane[3][0]._6_1_ = rgb[0x43];
      rgb_plane[3][0]._7_1_ = rgb[0x46];
      rgb_plane[3][1]._0_1_ = rgb[0x49];
      rgb_plane[3][1]._1_1_ = rgb[0x4c];
      rgb_plane[3][1]._2_1_ = rgb[0x4f];
      rgb_plane[3][1]._3_1_ = rgb[0x52];
      rgb_plane[3][1]._4_1_ = rgb[0x55];
      rgb_plane[3][1]._5_1_ = rgb[0x58];
      rgb_plane[3][1]._6_1_ = rgb[0x5b];
      rgb_plane[3][1]._7_1_ = rgb[0x5e];
      rgb_plane[4][0]._0_1_ = rgb[2];
      rgb_plane[4][0]._1_1_ = rgb[5];
      rgb_plane[4][0]._2_1_ = rgb[8];
      rgb_plane[4][0]._3_1_ = rgb[0xb];
      rgb_plane[4][0]._4_1_ = rgb[0xe];
      rgb_plane[4][0]._5_1_ = rgb[0x11];
      rgb_plane[4][0]._6_1_ = rgb[0x14];
      rgb_plane[4][0]._7_1_ = rgb[0x17];
      rgb_plane[4][1]._0_1_ = rgb[0x1a];
      rgb_plane[4][1]._1_1_ = rgb[0x1d];
      rgb_plane[4][1]._2_1_ = rgb[0x20];
      rgb_plane[4][1]._3_1_ = rgb[0x23];
      rgb_plane[4][1]._4_1_ = rgb[0x26];
      rgb_plane[4][1]._5_1_ = rgb[0x29];
      rgb_plane[4][1]._6_1_ = rgb[0x2c];
      rgb_plane[4][1]._7_1_ = rgb[0x2f];
      rgb_plane[5][0]._0_1_ = rgb[0x32];
      rgb_plane[5][0]._1_1_ = rgb[0x35];
      rgb_plane[5][0]._2_1_ = rgb[0x38];
      rgb_plane[5][0]._3_1_ = rgb[0x3b];
      rgb_plane[5][0]._4_1_ = rgb[0x3e];
      rgb_plane[5][0]._5_1_ = rgb[0x41];
      rgb_plane[5][0]._6_1_ = rgb[0x44];
      rgb_plane[5][0]._7_1_ = rgb[0x47];
      rgb_plane[5][1]._0_1_ = rgb[0x4a];
      rgb_plane[5][1]._1_1_ = rgb[0x4d];
      rgb_plane[5][1]._2_1_ = rgb[0x50];
      rgb_plane[5][1]._3_1_ = rgb[0x53];
      rgb_plane[5][1]._4_1_ = rgb[0x56];
      rgb_plane[5][1]._5_1_ = rgb[0x59];
      rgb_plane[5][1]._6_1_ = rgb[0x5c];
      rgb_plane[5][1]._7_1_ = rgb[0x5f];
      iVar68 = (int)lVar69;
      lVar70 = 0;
      do {
        auVar71 = *(undefined1 (*) [16])((long)rgb_plane[0] + lVar70);
        auVar84 = *(undefined1 (*) [16])((long)rgb_plane[2] + lVar70);
        auVar78 = *(undefined1 (*) [16])((long)rgb_plane[4] + lVar70);
        auVar18[0xd] = 0;
        auVar18._0_13_ = auVar71._0_13_;
        auVar18[0xe] = auVar71[7];
        auVar21[0xc] = auVar71[6];
        auVar21._0_12_ = auVar71._0_12_;
        auVar21._13_2_ = auVar18._13_2_;
        auVar24[0xb] = 0;
        auVar24._0_11_ = auVar71._0_11_;
        auVar24._12_3_ = auVar21._12_3_;
        auVar27[10] = auVar71[5];
        auVar27._0_10_ = auVar71._0_10_;
        auVar27._11_4_ = auVar24._11_4_;
        auVar32[9] = 0;
        auVar32._0_9_ = auVar71._0_9_;
        auVar32._10_5_ = auVar27._10_5_;
        auVar37[8] = auVar71[4];
        auVar37._0_8_ = auVar71._0_8_;
        auVar37._9_6_ = auVar32._9_6_;
        auVar49._7_8_ = 0;
        auVar49._0_7_ = auVar37._8_7_;
        Var50 = CONCAT81(SUB158(auVar49 << 0x40,7),auVar71[3]);
        auVar60._9_6_ = 0;
        auVar60._0_9_ = Var50;
        auVar51._1_10_ = SUB1510(auVar60 << 0x30,5);
        auVar51[0] = auVar71[2];
        auVar61._11_4_ = 0;
        auVar61._0_11_ = auVar51;
        auVar46[2] = auVar71[1];
        auVar46._0_2_ = auVar71._0_2_;
        auVar46._3_12_ = SUB1512(auVar61 << 0x20,3);
        auVar52._13_2_ = 0;
        auVar52._0_13_ = auVar46._2_13_;
        uVar73 = auVar84[7];
        auVar19[0xd] = 0;
        auVar19._0_13_ = auVar84._0_13_;
        auVar19[0xe] = uVar73;
        auVar22[0xc] = auVar84[6];
        auVar22._0_12_ = auVar84._0_12_;
        auVar22._13_2_ = auVar19._13_2_;
        auVar25[0xb] = 0;
        auVar25._0_11_ = auVar84._0_11_;
        auVar25._12_3_ = auVar22._12_3_;
        auVar28[10] = auVar84[5];
        auVar28._0_10_ = auVar84._0_10_;
        auVar28._11_4_ = auVar25._11_4_;
        auVar33[9] = 0;
        auVar33._0_9_ = auVar84._0_9_;
        auVar33._10_5_ = auVar28._10_5_;
        auVar38[8] = auVar84[4];
        auVar38._0_8_ = auVar84._0_8_;
        auVar38._9_6_ = auVar33._9_6_;
        auVar53._7_8_ = 0;
        auVar53._0_7_ = auVar38._8_7_;
        Var54 = CONCAT81(SUB158(auVar53 << 0x40,7),auVar84[3]);
        auVar62._9_6_ = 0;
        auVar62._0_9_ = Var54;
        auVar55._1_10_ = SUB1510(auVar62 << 0x30,5);
        auVar55[0] = auVar84[2];
        auVar63._11_4_ = 0;
        auVar63._0_11_ = auVar55;
        uVar79 = auVar84._0_2_;
        auVar47[2] = auVar84[1];
        auVar47._0_2_ = uVar79;
        auVar47._3_12_ = SUB1512(auVar63 << 0x20,3);
        auVar56._13_2_ = 0;
        auVar56._0_13_ = auVar47._2_13_;
        auVar20[0xd] = 0;
        auVar20._0_13_ = auVar78._0_13_;
        auVar20[0xe] = auVar78[7];
        auVar23[0xc] = auVar78[6];
        auVar23._0_12_ = auVar78._0_12_;
        auVar23._13_2_ = auVar20._13_2_;
        auVar26[0xb] = 0;
        auVar26._0_11_ = auVar78._0_11_;
        auVar26._12_3_ = auVar23._12_3_;
        auVar29[10] = auVar78[5];
        auVar29._0_10_ = auVar78._0_10_;
        auVar29._11_4_ = auVar26._11_4_;
        auVar34[9] = 0;
        auVar34._0_9_ = auVar78._0_9_;
        auVar34._10_5_ = auVar29._10_5_;
        auVar39[8] = auVar78[4];
        auVar39._0_8_ = auVar78._0_8_;
        auVar39._9_6_ = auVar34._9_6_;
        auVar57._7_8_ = 0;
        auVar57._0_7_ = auVar39._8_7_;
        Var58 = CONCAT81(SUB158(auVar57 << 0x40,7),auVar78[3]);
        auVar64._9_6_ = 0;
        auVar64._0_9_ = Var58;
        auVar59._1_10_ = SUB1510(auVar64 << 0x30,5);
        auVar59[0] = auVar78[2];
        auVar65._11_4_ = 0;
        auVar65._0_11_ = auVar59;
        auVar48[2] = auVar78[1];
        auVar48._0_2_ = auVar78._0_2_;
        auVar48._3_12_ = SUB1512(auVar65 << 0x20,3);
        uVar85 = (undefined2)Var54;
        auVar92._0_12_ = SUB1512(auVar52 << 0x10,0);
        auVar92._12_2_ = (short)Var50;
        auVar92._14_2_ = uVar85;
        auVar91._12_4_ = auVar92._12_4_;
        auVar91._0_10_ = SUB1510(auVar52 << 0x10,0);
        auVar91._10_2_ = auVar55._0_2_;
        auVar90._10_6_ = auVar91._10_6_;
        auVar90._8_2_ = auVar51._0_2_;
        auVar90._6_2_ = auVar47._2_2_;
        auVar90._4_2_ = auVar46._2_2_;
        auVar90._0_4_ = CONCAT22(uVar79,auVar71._0_2_) & 0xff00ff;
        auVar86._2_2_ = auVar38._8_2_;
        auVar86._0_2_ = auVar37._8_2_;
        auVar86._4_2_ = auVar27._10_2_;
        auVar86._6_2_ = auVar28._10_2_;
        auVar86._8_2_ = auVar21._12_2_;
        auVar86._10_2_ = auVar22._12_2_;
        auVar86[0xc] = auVar71[7];
        auVar86[0xd] = 0;
        auVar86[0xe] = uVar73;
        auVar86[0xf] = 0;
        auVar93._0_12_ = SUB1512(auVar56 << 0x10,0);
        auVar93._12_2_ = uVar85;
        auVar93._14_2_ = (short)Var58;
        auVar87._12_4_ = auVar93._12_4_;
        auVar87._0_10_ = SUB1510(auVar56 << 0x10,0);
        auVar87._10_2_ = auVar59._0_2_;
        auVar81._10_6_ = auVar87._10_6_;
        auVar81._8_2_ = auVar55._0_2_;
        auVar81._6_2_ = auVar48._2_2_;
        auVar81._4_2_ = auVar47._2_2_;
        auVar81._0_4_ = CONCAT22(auVar78._0_2_,uVar79) & 0xff00ff;
        auVar80._2_2_ = auVar39._8_2_;
        auVar80._0_2_ = auVar38._8_2_;
        auVar80._4_2_ = auVar28._10_2_;
        auVar80._6_2_ = auVar29._10_2_;
        auVar80._8_2_ = auVar22._12_2_;
        auVar80._10_2_ = auVar23._12_2_;
        auVar80[0xc] = uVar73;
        auVar80[0xd] = 0;
        auVar80[0xe] = auVar78[7];
        auVar80[0xf] = 0;
        auVar93 = pmaddwd(auVar90,auVar66);
        auVar87 = pmaddwd(auVar86,auVar66);
        auVar74 = pmaddwd(auVar81,auVar67);
        auVar81 = pmaddwd(auVar80,auVar67);
        auVar75._0_4_ = auVar74._0_4_ + auVar93._0_4_ + 0x108000U >> 0x10;
        auVar75._4_4_ = auVar74._4_4_ + auVar93._4_4_ + 0x108000U >> 0x10;
        auVar75._8_4_ = auVar74._8_4_ + auVar93._8_4_ + 0x108000U >> 0x10;
        auVar75._12_4_ = auVar74._12_4_ + auVar93._12_4_ + 0x108000U >> 0x10;
        auVar82._0_4_ = auVar81._0_4_ + auVar87._0_4_ + 0x108000U >> 0x10;
        auVar82._4_4_ = auVar81._4_4_ + auVar87._4_4_ + 0x108000U >> 0x10;
        auVar82._8_4_ = auVar81._8_4_ + auVar87._8_4_ + 0x108000U >> 0x10;
        auVar82._12_4_ = auVar81._12_4_ + auVar87._12_4_ + 0x108000U >> 0x10;
        auVar81 = packssdw(auVar75,auVar82);
        auVar83[1] = 0;
        auVar83[0] = auVar71[8];
        Var76 = (unkuint10)auVar71[0xc] << 0x40;
        auVar30[10] = auVar71[0xd];
        auVar30._0_10_ = Var76;
        auVar30[0xb] = 0;
        auVar88[1] = 0;
        auVar88[0] = auVar84[8];
        bVar72 = auVar84[0xc];
        uVar73 = auVar84[0xd];
        auVar31[10] = uVar73;
        auVar31._0_10_ = (unkuint10)bVar72 << 0x40;
        auVar31[0xb] = 0;
        auVar30[0xc] = auVar71[0xb];
        auVar30[0xd] = 0;
        auVar30[0xe] = auVar84[0xb];
        auVar35[10] = auVar84[10];
        auVar35._0_10_ = Var76;
        auVar35[0xb] = 0;
        auVar35._12_3_ = auVar30._12_3_;
        auVar40._10_5_ = auVar35._10_5_;
        auVar40._0_10_ = (unkuint10)auVar71[10] << 0x40;
        auVar42._8_7_ = auVar40._8_7_;
        auVar42._0_8_ = (ulong)auVar84[9] << 0x30;
        auVar44._6_9_ = auVar42._6_9_;
        auVar44._0_6_ = (uint6)auVar71[9] << 0x20;
        auVar83[2] = auVar84[8];
        auVar83[3] = 0;
        auVar83._4_11_ = auVar44._4_11_;
        auVar83[0xf] = 0;
        auVar77[1] = 0;
        auVar77[0] = auVar71[0xc];
        auVar74[1] = 0;
        auVar74[0] = bVar72;
        auVar77[2] = bVar72;
        auVar77[3] = 0;
        auVar77[4] = auVar71[0xd];
        auVar77[5] = 0;
        auVar77[6] = uVar73;
        auVar77[7] = 0;
        auVar77[8] = auVar71[0xe];
        auVar77[9] = 0;
        auVar77[10] = auVar84[0xe];
        auVar77[0xb] = 0;
        auVar77[0xc] = auVar71[0xf];
        auVar77[0xd] = 0;
        auVar77[0xe] = auVar84[0xf];
        auVar77[0xf] = 0;
        auVar31[0xc] = auVar84[0xb];
        auVar31[0xd] = 0;
        auVar31[0xe] = auVar78[0xb];
        auVar36[10] = auVar78[10];
        auVar36._0_10_ = (unkuint10)bVar72 << 0x40;
        auVar36[0xb] = 0;
        auVar36._12_3_ = auVar31._12_3_;
        auVar41._10_5_ = auVar36._10_5_;
        auVar41._0_10_ = (unkuint10)auVar84[10] << 0x40;
        auVar43._8_7_ = auVar41._8_7_;
        auVar43._0_8_ = (ulong)auVar78[9] << 0x30;
        auVar45._6_9_ = auVar43._6_9_;
        auVar45._0_6_ = (uint6)auVar84[9] << 0x20;
        auVar88[2] = auVar78[8];
        auVar88[3] = 0;
        auVar88._4_11_ = auVar45._4_11_;
        auVar88[0xf] = 0;
        auVar74[2] = auVar78[0xc];
        auVar74[3] = 0;
        auVar74[4] = uVar73;
        auVar74[5] = 0;
        auVar74[6] = auVar78[0xd];
        auVar74[7] = 0;
        auVar74[8] = auVar84[0xe];
        auVar74[9] = 0;
        auVar74[10] = auVar78[0xe];
        auVar74[0xb] = 0;
        auVar74[0xc] = auVar84[0xf];
        auVar74[0xd] = 0;
        auVar74[0xe] = auVar78[0xf];
        auVar74[0xf] = 0;
        auVar84 = pmaddwd(auVar83,auVar66);
        auVar78 = pmaddwd(auVar77,auVar66);
        auVar87 = pmaddwd(auVar88,auVar67);
        auVar71 = pmaddwd(auVar74,auVar67);
        auVar89._0_4_ = auVar87._0_4_ + auVar84._0_4_ + 0x108000 >> 0x10;
        auVar89._4_4_ = auVar87._4_4_ + auVar84._4_4_ + 0x108000 >> 0x10;
        auVar89._8_4_ = auVar87._8_4_ + auVar84._8_4_ + 0x108000 >> 0x10;
        auVar89._12_4_ = auVar87._12_4_ + auVar84._12_4_ + 0x108000 >> 0x10;
        auVar84._0_4_ = auVar71._0_4_ + auVar78._0_4_ + 0x108000 >> 0x10;
        auVar84._4_4_ = auVar71._4_4_ + auVar78._4_4_ + 0x108000 >> 0x10;
        auVar84._8_4_ = auVar71._8_4_ + auVar78._8_4_ + 0x108000 >> 0x10;
        auVar84._12_4_ = auVar71._12_4_ + auVar78._12_4_ + 0x108000 >> 0x10;
        auVar71 = packssdw(auVar89,auVar84);
        sVar2 = auVar81._0_2_;
        sVar3 = auVar81._2_2_;
        sVar4 = auVar81._4_2_;
        sVar5 = auVar81._6_2_;
        sVar6 = auVar81._8_2_;
        sVar7 = auVar81._10_2_;
        sVar8 = auVar81._12_2_;
        sVar9 = auVar81._14_2_;
        sVar10 = auVar71._0_2_;
        sVar11 = auVar71._2_2_;
        sVar12 = auVar71._4_2_;
        sVar13 = auVar71._6_2_;
        sVar14 = auVar71._8_2_;
        sVar15 = auVar71._10_2_;
        sVar16 = auVar71._12_2_;
        sVar17 = auVar71._14_2_;
        puVar1 = y + lVar70 + iVar68;
        *puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar81[0] - (0xff < sVar2);
        puVar1[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar81[2] - (0xff < sVar3);
        puVar1[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar81[4] - (0xff < sVar4);
        puVar1[3] = (0 < sVar5) * (sVar5 < 0x100) * auVar81[6] - (0xff < sVar5);
        puVar1[4] = (0 < sVar6) * (sVar6 < 0x100) * auVar81[8] - (0xff < sVar6);
        puVar1[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar81[10] - (0xff < sVar7);
        puVar1[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar81[0xc] - (0xff < sVar8);
        puVar1[7] = (0 < sVar9) * (sVar9 < 0x100) * auVar81[0xe] - (0xff < sVar9);
        puVar1[8] = (0 < sVar10) * (sVar10 < 0x100) * auVar71[0] - (0xff < sVar10);
        puVar1[9] = (0 < sVar11) * (sVar11 < 0x100) * auVar71[2] - (0xff < sVar11);
        puVar1[10] = (0 < sVar12) * (sVar12 < 0x100) * auVar71[4] - (0xff < sVar12);
        puVar1[0xb] = (0 < sVar13) * (sVar13 < 0x100) * auVar71[6] - (0xff < sVar13);
        puVar1[0xc] = (0 < sVar14) * (sVar14 < 0x100) * auVar71[8] - (0xff < sVar14);
        puVar1[0xd] = (0 < sVar15) * (sVar15 < 0x100) * auVar71[10] - (0xff < sVar15);
        puVar1[0xe] = (0 < sVar16) * (sVar16 < 0x100) * auVar71[0xc] - (0xff < sVar16);
        puVar1[0xf] = (0 < sVar17) * (sVar17 < 0x100) * auVar71[0xe] - (0xff < sVar17);
        lVar70 = lVar70 + 0x10;
      } while (lVar70 == 0x10);
      rgb = rgb + 0x60;
      lVar69 = iVar68 + lVar70;
    } while (iVar68 + (int)lVar70 < (int)(width & 0xffffffe0U));
    iVar68 = iVar68 + (int)lVar70;
  }
  if (iVar68 < width) {
    lVar69 = (long)iVar68;
    do {
      y[lVar69] = (uint8_t)((uint)rgb[2] * 0x1914 + (uint)rgb[1] * 0x8123 + (uint)*rgb * 0x41c7 +
                            0x108000 >> 0x10);
      lVar69 = lVar69 + 1;
      rgb = rgb + 3;
    } while (width != lVar69);
  }
  return;
}

Assistant:

static void ConvertRGB24ToY_SSE2(const uint8_t* WEBP_RESTRICT rgb,
                                 uint8_t* WEBP_RESTRICT y, int width) {
  const int max_width = width & ~31;
  int i;
  for (i = 0; i < max_width; rgb += 3 * 16 * 2) {
    __m128i rgb_plane[6];
    int j;

    RGB24PackedToPlanar_SSE2(rgb, rgb_plane);

    for (j = 0; j < 2; ++j, i += 16) {
      const __m128i zero = _mm_setzero_si128();
      __m128i r, g, b, Y0, Y1;

      // Convert to 16-bit Y.
      r = _mm_unpacklo_epi8(rgb_plane[0 + j], zero);
      g = _mm_unpacklo_epi8(rgb_plane[2 + j], zero);
      b = _mm_unpacklo_epi8(rgb_plane[4 + j], zero);
      ConvertRGBToY_SSE2(&r, &g, &b, &Y0);

      // Convert to 16-bit Y.
      r = _mm_unpackhi_epi8(rgb_plane[0 + j], zero);
      g = _mm_unpackhi_epi8(rgb_plane[2 + j], zero);
      b = _mm_unpackhi_epi8(rgb_plane[4 + j], zero);
      ConvertRGBToY_SSE2(&r, &g, &b, &Y1);

      // Cast to 8-bit and store.
      STORE_16(_mm_packus_epi16(Y0, Y1), y + i);
    }
  }
  for (; i < width; ++i, rgb += 3) {   // left-over
    y[i] = VP8RGBToY(rgb[0], rgb[1], rgb[2], YUV_HALF);
  }
}